

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O0

void __thiscall
InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution
          (InterleavedSudoku *this,
          vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields,
          int maxPossible,bool fixFieldChooseRandomly,bool debug)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  __shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  ostream *poVar6;
  int correctValue;
  shared_ptr<Field> *field;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *__range2;
  int z;
  int y;
  int x;
  int posZtoFix;
  int posYtoFix;
  int posXtoFix;
  bool debug_local;
  bool fixFieldChooseRandomly_local;
  int maxPossible_local;
  vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields_local;
  InterleavedSudoku *this_local;
  
  posZtoFix = 0;
  x = 0;
  y = 0;
  if (fixFieldChooseRandomly) {
    do {
      iVar2 = rand();
      posZtoFix = iVar2 % (this->super_Sudoku).squared_size_;
      iVar2 = rand();
      x = iVar2 % (this->super_Sudoku).squared_size_;
      iVar2 = rand();
      y = iVar2 % 2;
      pcVar3 = index(this,(char *)(ulong)(uint)posZtoFix,x);
      p_Var4 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::
               operator[](testFields,(long)(int)pcVar3);
      peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var4);
      iVar2 = Field::value(peVar5);
    } while (iVar2 != 0);
  }
  else {
    __end2 = std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::begin
                       (testFields);
    field = (shared_ptr<Field> *)
            std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::end
                      (testFields);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
                                       *)&field), bVar1) {
      p_Var4 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
               ::operator*(&__end2);
      peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         (p_Var4);
      iVar2 = Field::value(peVar5);
      if (iVar2 == 0) {
        peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var4);
        iVar2 = Field::n_possible(peVar5);
        if (iVar2 == maxPossible) {
          peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var4);
          posZtoFix = Field::pos_x(peVar5);
          peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var4);
          x = Field::pos_y(peVar5);
          peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var4);
          y = Field::pos_z(peVar5);
          break;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Field>_*,_std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>_>
      ::operator++(&__end2);
    }
  }
  pcVar3 = index(this,(char *)(ulong)(uint)posZtoFix,x);
  p_Var4 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::operator[]
                     (&(this->super_Sudoku).fields_,(long)(int)pcVar3);
  peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var4);
  iVar2 = Field::value(peVar5);
  pcVar3 = index(this,(char *)(ulong)(uint)posZtoFix,x);
  p_Var4 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::operator[]
                     (testFields,(long)(int)pcVar3);
  peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var4);
  Field::setValue(peVar5,iVar2);
  pcVar3 = index(this,(char *)(ulong)(uint)posZtoFix,x);
  p_Var4 = (__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           std::vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>::operator[]
                     (testFields,(long)(int)pcVar3);
  peVar5 = std::__shared_ptr_access<Field,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (p_Var4);
  Field::setFixed(peVar5,true);
  if (debug) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Fix field (");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,posZtoFix);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,x);
    poVar6 = std::operator<<(poVar6,",");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,y);
    poVar6 = std::operator<<(poVar6,") to value ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar2);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void InterleavedSudoku::chooseOpenFieldInTestFieldsAndFixToSolution(std::vector< std::shared_ptr< Field > >& testFields, int maxPossible, bool fixFieldChooseRandomly, bool debug)
{
  int posXtoFix = 0;
  int posYtoFix = 0;
  int posZtoFix = 0;

  if(fixFieldChooseRandomly)
  {
    for(;;)
    {
      int x = rand() % (squared_size_);
      int y = rand() % (squared_size_);
      int z = rand() % 2;
      if(testFields[index(x,y,z)]->value() == 0)
      {
	posXtoFix = x;
	posYtoFix = y;
	posZtoFix = z;
	break;
      }
    }
  }
  else
  {
    //take the first field that has the maximum number of possibilities
    for(auto &field : testFields)
    {
      if(field->value() != 0)
	continue;

      if(field->n_possible() == maxPossible)
      {
	posXtoFix = field->pos_x();
	posYtoFix = field->pos_y();
	posZtoFix = field->pos_z();
	break;
      }
    }
  }

  int correctValue = fields_[index(posXtoFix, posYtoFix, posZtoFix)]->value();

  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setValue(correctValue);
  testFields[index(posXtoFix, posYtoFix, posZtoFix)]->setFixed(true);

  if(debug)
    std::cout<<"Fix field ("<<posXtoFix<<","<<posYtoFix<<","<<posZtoFix<<") to value "<<correctValue<<std::endl;
}